

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantValue.h
# Opt level: O1

string * __thiscall
flow::ConstantValue<flow::util::RegExp,(flow::LiteralType)7>::to_string_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  basic_string_view<char> format_str;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args;
  undefined4 local_26c;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined4 *local_258;
  code *local_250;
  long local_248;
  code *local_240;
  undefined **local_230;
  undefined1 *local_228;
  long lStack_220;
  ulong local_218;
  undefined1 local_210 [504];
  
  local_26c = *(undefined4 *)((long)this + 8);
  local_258 = &local_26c;
  local_268 = *(undefined8 *)((long)this + 0x10);
  uStack_260 = *(undefined8 *)((long)this + 0x18);
  local_248 = (long)this + 0x48;
  local_250 = fmt::v5::internal::
              value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
              ::format_custom_arg<flow::LiteralType>;
  local_240 = fmt::v5::internal::
              value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
              ::format_custom_arg<flow::util::RegExp>;
  lStack_220 = 0;
  local_230 = &PTR_grow_0019d320;
  local_218 = 500;
  format_str.size_ = 0x16;
  format_str.data_ = "Constant \'{}\': {} = {}";
  args.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_268;
  args.types_ = 0xddb;
  local_228 = local_210;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_230,format_str,args);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_228,local_228 + lStack_220);
  local_230 = &PTR_grow_0019d320;
  if (local_228 != local_210) {
    operator_delete(local_228,local_218);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string to_string() const override {
    return fmt::format("Constant '{}': {} = {}", name(), type(), value_);
  }